

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O2

void __thiscall Assimp::ASE::Mesh::~Mesh(Mesh *this)

{
  long lVar1;
  
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::~vector(&this->mBones);
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::~vector
            (&this->mBoneVertices);
  std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
            (&(this->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>);
  lVar1 = 0x248;
  do {
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              ((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&(this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x188);
  BaseNode::~BaseNode(&this->super_BaseNode);
  MeshWithSmoothingGroups<Assimp::ASE::Face>::~MeshWithSmoothingGroups
            (&this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>);
  return;
}

Assistant:

Mesh() = delete;